

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vis_helper.c
# Opt level: O0

uint64_t helper_fmuld8sux16(uint64_t src1,uint64_t src2)

{
  uint uVar1;
  undefined4 local_2c;
  short sStack_28;
  short sStack_26;
  uint32_t tmp;
  VIS64 d;
  VIS64 s;
  uint64_t src2_local;
  uint64_t src1_local;
  
  sStack_26 = (short)(src2 >> 0x10);
  d.w[1] = (uint16_t)(src1 >> 0x10);
  local_2c = (int)sStack_26 * ((int)d.sw[1] >> 8);
  if (0x7f < (local_2c & 0xff)) {
    local_2c = local_2c + 0x100;
  }
  uVar1 = local_2c;
  sStack_28 = (short)src2;
  d.w[0] = (uint16_t)src1;
  local_2c = (int)sStack_28 * ((int)d.sw[0] >> 8);
  if (0x7f < (local_2c & 0xff)) {
    local_2c = local_2c + 0x100;
  }
  _sStack_28 = CONCAT44(uVar1,local_2c);
  return _sStack_28;
}

Assistant:

uint64_t helper_fmuld8sux16(uint64_t src1, uint64_t src2)
{
    VIS64 s, d;
    uint32_t tmp;

    s.ll = src1;
    d.ll = src2;

#define PMUL(r)                                                         \
    tmp = (int32_t)d.VIS_SW64(r) * ((int32_t)s.VIS_SW64(r) >> 8);       \
    if ((tmp & 0xff) > 0x7f) {                                          \
        tmp += 0x100;                                                   \
    }                                                                   \
    d.VIS_L64(r) = tmp;

    /* Reverse calculation order to handle overlap */
    PMUL(1);
    PMUL(0);
#undef PMUL

    return d.ll;
}